

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int perform_top_color_palette_search
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int dc_mode_cost,
              int16_t *data,int16_t *top_colors,int start_n,int end_n,int step_size,
              _Bool do_header_rd_based_gating,int *last_n_searched,uint16_t *color_cache,int n_cache
              ,MB_MODE_INFO *best_mbmi,uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,
              int *rate_tokenonly,int64_t *distortion,uint8_t *skippable,int *beat_best_rd,
              PICK_MODE_CONTEXT *ctx,uint8_t *best_blk_skip,uint8_t *tx_type_map,
              int discount_color_cost)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  undefined1 in_CL;
  int *in_RDX;
  int *unaff_RBX;
  _Bool *unaff_RBP;
  int *in_RSI;
  int64_t *in_RDI;
  undefined4 in_R8D;
  uint8_t *in_R9;
  PICK_MODE_CONTEXT *unaff_R12;
  uint8_t *unaff_R13;
  uint8_t *unaff_R14;
  int *unaff_R15;
  int unaff_retaddr;
  void *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  BLOCK_SIZE in_stack_00000028;
  int *in_stack_00000030;
  int16_t *in_stack_00000038;
  int in_stack_00000040;
  MB_MODE_INFO *in_stack_00000048;
  MACROBLOCK *in_stack_00000050;
  AV1_COMP *in_stack_00000058;
  undefined4 in_stack_000000a0;
  _Bool do_header_rd_based_breakout;
  int beat_best_palette_rd;
  int top_color_winner;
  int n;
  int16_t centroids [8];
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff78;
  int iVar3;
  int in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined3 in_stack_ffffffffffffffac;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  uVar4 = CONCAT13(in_CL,in_stack_ffffffffffffffac);
  BVar1 = in_stack_00000028 & BLOCK_4X8;
  iVar3 = in_stack_00000018;
  while( true ) {
    iVar2 = is_iter_over(in_stack_00000010,in_stack_00000018,in_stack_00000020);
    if (iVar2 != 0) {
      return iVar3;
    }
    in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 & 0xffffff;
    memcpy(&stack0xffffffffffffff88,in_stack_00000008,(long)in_stack_00000010 << 1);
    palette_rd_y(in_stack_00000058,in_stack_00000050,in_stack_00000048,BVar1 & BLOCK_4X8,
                 in_stack_00000040,in_stack_00000038,
                 (int16_t *)CONCAT44(in_stack_000000a0,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff78,(uint16_t *)CONCAT44(in_stack_00000010,iVar3),
                 in_stack_ffffffffffffff88,SUB41((uint)in_stack_00000010 >> 0x18,0),
                 (MB_MODE_INFO *)CONCAT17(BVar1,in_stack_ffffffffffffff98),in_R9,
                 (int64_t *)CONCAT44(uVar4,in_R8D),in_RDX,in_RSI,in_RDI,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_RBX,
                 unaff_R12,unaff_R13,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr);
    *in_stack_00000030 = in_stack_00000010;
    if ((in_stack_ffffffffffffff78 & 0x1000000) != 0) break;
    if (*(int *)((long)in_RDI + 0x60b9c) == 2) {
      return iVar3;
    }
    in_stack_00000010 = in_stack_00000020 + in_stack_00000010;
  }
  *in_stack_00000030 = in_stack_00000018;
  return iVar3;
}

Assistant:

static inline int perform_top_color_palette_search(
    const AV1_COMP *const cpi, MACROBLOCK *x, MB_MODE_INFO *mbmi,
    BLOCK_SIZE bsize, int dc_mode_cost, const int16_t *data,
    int16_t *top_colors, int start_n, int end_n, int step_size,
    bool do_header_rd_based_gating, int *last_n_searched, uint16_t *color_cache,
    int n_cache, MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map,
    int64_t *best_rd, int *rate, int *rate_tokenonly, int64_t *distortion,
    uint8_t *skippable, int *beat_best_rd, PICK_MODE_CONTEXT *ctx,
    uint8_t *best_blk_skip, uint8_t *tx_type_map, int discount_color_cost) {
  int16_t centroids[PALETTE_MAX_SIZE];
  int n = start_n;
  int top_color_winner = end_n;
  /* clang-format off */
  assert(IMPLIES(step_size < 0, start_n > end_n));
  /* clang-format on */
  assert(IMPLIES(step_size > 0, start_n < end_n));
  while (!is_iter_over(n, end_n, step_size)) {
    int beat_best_palette_rd = 0;
    bool do_header_rd_based_breakout = false;
    memcpy(centroids, top_colors, n * sizeof(top_colors[0]));
    palette_rd_y(cpi, x, mbmi, bsize, dc_mode_cost, data, centroids, n,
                 color_cache, n_cache, do_header_rd_based_gating, best_mbmi,
                 best_palette_color_map, best_rd, rate, rate_tokenonly,
                 distortion, skippable, beat_best_rd, ctx, best_blk_skip,
                 tx_type_map, &beat_best_palette_rd,
                 &do_header_rd_based_breakout, discount_color_cost);
    *last_n_searched = n;
    if (do_header_rd_based_breakout) {
      // Terminate palette_size search by setting last_n_searched to end_n.
      *last_n_searched = end_n;
      break;
    }
    if (beat_best_palette_rd) {
      top_color_winner = n;
    } else if (cpi->sf.intra_sf.prune_palette_search_level == 2) {
      // At search level 2, we return immediately if we don't see an improvement
      return top_color_winner;
    }
    n += step_size;
  }
  return top_color_winner;
}